

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int compare_dir_entries(void *p1,void *p2)

{
  int local_54;
  int local_50;
  int local_4c;
  char *local_48;
  int local_3c;
  int cmp_result;
  char *qs;
  dir_entry *b;
  dir_entry *a;
  void *p2_local;
  void *p1_local;
  
  if (*(long *)(*p1 + 0x20) == 0) {
    local_48 = "na";
  }
  else {
    local_48 = *(char **)(*p1 + 0x20);
  }
  local_3c = 0;
  if (((*(uint *)((long)p1 + 0x28) & 0xf000) == 0x4000) &&
     ((*(uint *)((long)p2 + 0x28) & 0xf000) != 0x4000)) {
    p1_local._4_4_ = -1;
  }
  else if (((*(uint *)((long)p1 + 0x28) & 0xf000) == 0x4000) ||
          ((*(uint *)((long)p2 + 0x28) & 0xf000) != 0x4000)) {
    if (*local_48 == 'n') {
      local_3c = strcmp(*(char **)((long)p1 + 8),*(char **)((long)p2 + 8));
    }
    else if (*local_48 == 's') {
      if (*(long *)((long)p1 + 0x40) == *(long *)((long)p2 + 0x40)) {
        local_4c = 0;
      }
      else {
        local_4c = -1;
        if (*(long *)((long)p2 + 0x40) < *(long *)((long)p1 + 0x40)) {
          local_4c = 1;
        }
      }
      local_3c = local_4c;
    }
    else if (*local_48 == 'd') {
      if (*(long *)((long)p1 + 0x68) == *(long *)((long)p2 + 0x68)) {
        local_50 = 0;
      }
      else {
        local_50 = -1;
        if (*(long *)((long)p2 + 0x68) < *(long *)((long)p1 + 0x68)) {
          local_50 = 1;
        }
      }
      local_3c = local_50;
    }
    if (local_48[1] == 'd') {
      local_54 = -local_3c;
    }
    else {
      local_54 = local_3c;
    }
    p1_local._4_4_ = local_54;
  }
  else {
    p1_local._4_4_ = 1;
  }
  return p1_local._4_4_;
}

Assistant:

static int __cdecl compare_dir_entries(const void *p1, const void *p2) {
  const struct dir_entry *a = (const struct dir_entry *) p1,
        *b = (const struct dir_entry *) p2;
  const char *qs = a->conn->mg_conn.query_string ?
    a->conn->mg_conn.query_string : "na";
  int cmp_result = 0;

  if (S_ISDIR(a->st.st_mode) && !S_ISDIR(b->st.st_mode)) {
    return -1;  // Always put directories on top
  } else if (!S_ISDIR(a->st.st_mode) && S_ISDIR(b->st.st_mode)) {
    return 1;   // Always put directories on top
  } else if (*qs == 'n') {
    cmp_result = strcmp(a->file_name, b->file_name);
  } else if (*qs == 's') {
    cmp_result = a->st.st_size == b->st.st_size ? 0 :
      a->st.st_size > b->st.st_size ? 1 : -1;
  } else if (*qs == 'd') {
    cmp_result = a->st.st_mtime == b->st.st_mtime ? 0 :
      a->st.st_mtime > b->st.st_mtime ? 1 : -1;
  }

  return qs[1] == 'd' ? -cmp_result : cmp_result;
}